

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3PcacheMove(PgHdr *p,Pgno newPgno)

{
  PCache *pCache;
  Pgno newPgno_local;
  PgHdr *p_local;
  
  (*sqlite3Config.pcache2.xRekey)(p->pCache->pCache,p->pPage,p->pgno,newPgno);
  p->pgno = newPgno;
  if (((p->flags & 2) != 0) && ((p->flags & 8) != 0)) {
    pcacheManageDirtyList(p,'\x03');
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3PcacheMove(PgHdr *p, Pgno newPgno){
  PCache *pCache = p->pCache;
  assert( p->nRef>0 );
  assert( newPgno>0 );
  assert( sqlite3PcachePageSanity(p) );
  pcacheTrace(("%p.MOVE %d -> %d\n",pCache,p->pgno,newPgno));
  sqlite3GlobalConfig.pcache2.xRekey(pCache->pCache, p->pPage, p->pgno,newPgno);
  p->pgno = newPgno;
  if( (p->flags&PGHDR_DIRTY) && (p->flags&PGHDR_NEED_SYNC) ){
    pcacheManageDirtyList(p, PCACHE_DIRTYLIST_FRONT);
  }
}